

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
resizeImpl<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
          (SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *this,
          size_type newSize,ValueInitTag *val)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ValueInitTag temp;
  undefined8 uStack_8;
  
  uVar1 = *(ulong *)(this + 8);
  uStack_8 = newSize - uVar1;
  if (uVar1 <= newSize) {
    if (uVar1 <= newSize && uStack_8 != 0) {
      if (*(ulong *)(this + 0x10) < newSize) {
        resizeRealloc<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
                  (this,newSize,(ValueInitTag *)((long)&uStack_8 + 7));
      }
      else {
        if (0 < uStack_8) {
          uVar2 = uStack_8 + 1;
          lVar3 = uVar1 * 0x40 + *(long *)this + 0x3c;
          do {
            *(undefined8 *)(lVar3 + -4) = 0;
            uVar2 = uVar2 - 1;
            lVar3 = lVar3 + 0x40;
          } while (1 < uVar2);
        }
        *(size_type *)(this + 8) = newSize;
      }
      return;
    }
  }
  else {
    *(size_type *)(this + 8) = newSize;
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }